

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

QMetaType __thiscall QMetaObject::metaType(QMetaObject *this)

{
  QMetaType *pQVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  QMetaTypeInterface *pQVar5;
  QMetaTypeInterface **ppQVar6;
  QMetaType QVar7;
  QMetaType *pQVar8;
  uint uVar9;
  QMetaTypeInterface **ppQVar10;
  QByteArrayView typeName;
  QByteArrayView typeName_00;
  QByteArrayView typeName_01;
  
  puVar3 = (this->d).data;
  uVar2 = *puVar3;
  ppQVar10 = (QMetaTypeInterface **)(ulong)uVar2;
  if ((int)uVar2 < 10) {
    puVar4 = (this->d).stringdata;
    typeName.m_size = (ulong)puVar4[(long)(int)puVar3[1] * 2] + (long)puVar4;
    if (puVar4 != (uint *)0x0) {
      pQVar8 = (QMetaType *)0xffffffffffffffff;
      do {
        pQVar1 = (QMetaType *)((long)&pQVar8->d_ptr + 1);
        ppQVar10 = &pQVar8->d_ptr;
        pQVar8 = pQVar1;
      } while (*(char *)((long)ppQVar10 + typeName.m_size + 1) != '\0');
      typeName.m_data._0_4_ = uVar2;
      typeName.m_data._4_4_ = 0;
      QVar7 = QMetaType::fromName(pQVar1,typeName);
      return (QMetaType)QVar7.d_ptr;
    }
  }
  else {
    uVar9 = puVar3[6];
    if (0xb < (int)uVar2) {
      uVar9 = uVar9 + puVar3[8];
    }
    ppQVar10 = (this->d).metaTypes;
    pQVar5 = ppQVar10[(int)uVar9];
    if (pQVar5 != (QMetaTypeInterface *)0x0) {
      QVar7.d_ptr = (QMetaTypeInterface *)0x0;
      if ((pQVar5->typeId)._q_value.super___atomic_base<int>._M_i != 0x2b) {
        QVar7.d_ptr = pQVar5;
      }
      return (QMetaType)QVar7.d_ptr;
    }
    puVar4 = (this->d).stringdata;
    typeName_00.m_size = (ulong)puVar4[(long)(int)puVar3[1] * 2] + (long)puVar4;
    typeName.m_size = typeName_00.m_size;
    if (puVar4 != (uint *)0x0) {
      pQVar8 = (QMetaType *)0xffffffffffffffff;
      do {
        pQVar1 = (QMetaType *)((long)&pQVar8->d_ptr + 1);
        ppQVar6 = &pQVar8->d_ptr;
        pQVar8 = pQVar1;
      } while (*(char *)((long)ppQVar6 + typeName_00.m_size + 1) != '\0');
      typeName_00.m_data = (storage_type *)ppQVar10;
      QVar7 = QMetaType::fromName(pQVar1,typeName_00);
      return (QMetaType)QVar7.d_ptr;
    }
  }
  typeName_01.m_data = (storage_type *)ppQVar10;
  typeName_01.m_size = typeName.m_size;
  QVar7 = QMetaType::fromName((QMetaType *)0x0,typeName_01);
  return (QMetaType)QVar7.d_ptr;
}

Assistant:

QMetaType QMetaObject::metaType() const
{

    const QMetaObjectPrivate *d = priv(this->d.data);
    if (d->revision < 10) {
        // before revision 10, we did not store the metatype in the metatype array
        return QMetaType::fromName(className());
    } else {
        /* in the metatype array, we store

         | index                               | data                           |
         |----------------------------------------------------------------------|
         | 0                                   | QMetaType(property0)           |
         | ...                                 | ...                            |
         | propertyCount - 1                   | QMetaType(propertyCount - 1)   |
         | propertyCount                       | QMetaType(enumerator0)         |
         | ...                                 | ...                            |
         | propertyCount + enumeratorCount - 1 | QMetaType(enumeratorCount - 1) |
         | propertyCount + enumeratorCount     | QMetaType(class)               |

        */
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0)
        // Before revision 12 we only stored metatypes for enums if they showed
        // up as types of properties or method arguments or return values.
        // From revision 12 on, we always store them in a predictable place.
        const qsizetype offset = d->revision < 12
                ? d->propertyCount
                : d->propertyCount + d->enumeratorCount;
#else
        const qsizetype offset = d->propertyCount + d->enumeratorCount;
#endif

        auto iface = this->d.metaTypes[offset];
        if (iface && QtMetaTypePrivate::isInterfaceFor<void>(iface))
            return QMetaType(); // return invalid meta-type for namespaces
        if (iface)
            return QMetaType(iface);
        else // in case of a dynamic metaobject, we might have no metatype stored
            return QMetaType::fromName(className()); // try lookup by name in that case
    }
}